

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trompeloeil.hpp
# Opt level: O3

void __thiscall
trompeloeil::
call_matcher<int_&(int_&),_std::tuple<trompeloeil::predicate_matcher<trompeloeil::lambdas::equal,_trompeloeil::lambdas::equal_printer,_trompeloeil::typed_matcher<int_&>,_int>_>_>
::run_actions(call_matcher<int_&(int_&),_std::tuple<trompeloeil::predicate_matcher<trompeloeil::lambdas::equal,_trompeloeil::lambdas::equal_printer,_trompeloeil::typed_matcher<int_&>,_int>_>_>
              *this,call_params_type_t<int_&(int_&)> *params,
             call_matcher_list<int_&(int_&)> *saturated_list)

{
  trompeloeil *this_00;
  char *name;
  char *pcVar1;
  list_elem<trompeloeil::call_matcher_base<int_&(int_&)>_> *plVar2;
  list_elem<trompeloeil::call_matcher_base<int_&(int_&)>_> *plVar3;
  int iVar4;
  ulong uVar5;
  sequence_handler_base *psVar6;
  string *in_R8;
  side_effect_base<int_&(int_&)> *a;
  list_elem<trompeloeil::side_effect_base<int_&(int_&)>_> *plVar7;
  location loc;
  unique_lock<std::recursive_mutex> lock;
  string local_50;
  
  if (((this->sequences)._M_t.
       super___uniq_ptr_impl<trompeloeil::sequence_handler_base,_std::default_delete<trompeloeil::sequence_handler_base>_>
       ._M_t.
       super__Tuple_impl<0UL,_trompeloeil::sequence_handler_base_*,_std::default_delete<trompeloeil::sequence_handler_base>_>
       .super__Head_base<0UL,_trompeloeil::sequence_handler_base_*,_false>._M_head_impl)->max_calls
      == 0) {
    this->reported = true;
    this_00 = (trompeloeil *)(this->super_call_matcher_base<int_&(int_&)>).name;
    name = (this->super_call_matcher_base<int_&(int_&)>).loc.file;
    pcVar1 = (char *)(this->super_call_matcher_base<int_&(int_&)>).loc.line;
    params_string<int&>(&local_50,(trompeloeil *)params,(tuple<int_&> *)saturated_list);
    loc.line = (unsigned_long)&local_50;
    loc.file = pcVar1;
    report_forbidden_call(this_00,name,loc,in_R8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
  }
  get_lock<void>();
  iVar4 = (*((this->sequences)._M_t.
             super___uniq_ptr_impl<trompeloeil::sequence_handler_base,_std::default_delete<trompeloeil::sequence_handler_base>_>
             ._M_t.
             super__Tuple_impl<0UL,_trompeloeil::sequence_handler_base_*,_std::default_delete<trompeloeil::sequence_handler_base>_>
             .super__Head_base<0UL,_trompeloeil::sequence_handler_base_*,_false>._M_head_impl)->
            _vptr_sequence_handler_base[3])();
  if ((char)iVar4 == '\0') {
    psVar6 = (this->sequences)._M_t.
             super___uniq_ptr_impl<trompeloeil::sequence_handler_base,_std::default_delete<trompeloeil::sequence_handler_base>_>
             ._M_t.
             super__Tuple_impl<0UL,_trompeloeil::sequence_handler_base_*,_std::default_delete<trompeloeil::sequence_handler_base>_>
             .super__Head_base<0UL,_trompeloeil::sequence_handler_base_*,_false>._M_head_impl;
    (*psVar6->_vptr_sequence_handler_base[2])
              (psVar6,0,(this->super_call_matcher_base<int_&(int_&)>).name,
               (this->super_call_matcher_base<int_&(int_&)>).loc.file,
               (this->super_call_matcher_base<int_&(int_&)>).loc.line);
  }
  psVar6 = (this->sequences)._M_t.
           super___uniq_ptr_impl<trompeloeil::sequence_handler_base,_std::default_delete<trompeloeil::sequence_handler_base>_>
           ._M_t.
           super__Tuple_impl<0UL,_trompeloeil::sequence_handler_base_*,_std::default_delete<trompeloeil::sequence_handler_base>_>
           .super__Head_base<0UL,_trompeloeil::sequence_handler_base_*,_false>._M_head_impl;
  uVar5 = psVar6->call_count + 1;
  psVar6->call_count = uVar5;
  if (psVar6->min_calls <= uVar5) {
    (*psVar6->_vptr_sequence_handler_base[6])();
    psVar6 = (this->sequences)._M_t.
             super___uniq_ptr_impl<trompeloeil::sequence_handler_base,_std::default_delete<trompeloeil::sequence_handler_base>_>
             ._M_t.
             super__Tuple_impl<0UL,_trompeloeil::sequence_handler_base_*,_std::default_delete<trompeloeil::sequence_handler_base>_>
             .super__Head_base<0UL,_trompeloeil::sequence_handler_base_*,_false>._M_head_impl;
    uVar5 = psVar6->call_count;
  }
  if (uVar5 == psVar6->max_calls) {
    (*psVar6->_vptr_sequence_handler_base[5])();
    plVar2 = (this->super_call_matcher_base<int_&(int_&)>).
             super_list_elem<trompeloeil::call_matcher_base<int_&(int_&)>_>.next;
    plVar3 = (this->super_call_matcher_base<int_&(int_&)>).
             super_list_elem<trompeloeil::call_matcher_base<int_&(int_&)>_>.prev;
    plVar2->prev = plVar3;
    plVar3->next = plVar2;
    (this->super_call_matcher_base<int_&(int_&)>).
    super_list_elem<trompeloeil::call_matcher_base<int_&(int_&)>_>.prev =
         (list_elem<trompeloeil::call_matcher_base<int_&(int_&)>_> *)this;
    plVar2 = (saturated_list->
             super_list<trompeloeil::call_matcher_base<int_&(int_&)>,_trompeloeil::ignore_disposer>)
             .super_list_elem<trompeloeil::call_matcher_base<int_&(int_&)>_>.prev;
    (this->super_call_matcher_base<int_&(int_&)>).
    super_list_elem<trompeloeil::call_matcher_base<int_&(int_&)>_>.prev = plVar2;
    (this->super_call_matcher_base<int_&(int_&)>).
    super_list_elem<trompeloeil::call_matcher_base<int_&(int_&)>_>.next =
         (list_elem<trompeloeil::call_matcher_base<int_&(int_&)>_> *)saturated_list;
    plVar2->next = (list_elem<trompeloeil::call_matcher_base<int_&(int_&)>_> *)this;
    (saturated_list->
    super_list<trompeloeil::call_matcher_base<int_&(int_&)>,_trompeloeil::ignore_disposer>).
    super_list_elem<trompeloeil::call_matcher_base<int_&(int_&)>_>.prev =
         (list_elem<trompeloeil::call_matcher_base<int_&(int_&)>_> *)this;
  }
  for (plVar7 = (this->actions).super_list_elem<trompeloeil::side_effect_base<int_&(int_&)>_>.next;
      plVar7 != &(this->actions).super_list_elem<trompeloeil::side_effect_base<int_&(int_&)>_>;
      plVar7 = plVar7->next) {
    (*plVar7->_vptr_list_elem[2])(plVar7,params);
  }
  std::unique_lock<std::recursive_mutex>::~unique_lock
            ((unique_lock<std::recursive_mutex> *)&local_50);
  return;
}

Assistant:

void
    run_actions(
      call_params_type_t<Sig>& params,
      call_matcher_list<Sig> &saturated_list)
    override
    {
      if (sequences->is_forbidden())
      {
        reported = true;
        report_forbidden_call(name, loc, params_string(params));
      }
      auto lock = get_lock();
      {
        if (!sequences->can_be_called())
        {
          sequences->validate(severity::fatal, name, loc);
        }
        sequences->increment_call();
        if (sequences->is_satisfied())
        {
          sequences->retire_predecessors();
        }
        if (sequences->is_saturated())
        {
          sequences->retire();
          this->unlink();
          saturated_list.push_back(this);
        }
      }
      for (auto& a : actions) a.action(params);
    }